

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O0

void __thiscall ezc3d::DataNS::Points3dNS::Point::print(Point *this)

{
  const_reference cVar1;
  ostream *poVar2;
  ostream *poVar3;
  size_type sVar4;
  Vector3d *in_RDI;
  double extraout_XMM0_Qa;
  vector<bool,_std::allocator<bool>_> *in_stack_00000010;
  size_t i;
  vector<bool,_std::allocator<bool>_> *pvVar5;
  vector<bool,_std::allocator<bool>_> *this_00;
  
  Vector3d::print(in_RDI);
  poVar2 = std::operator<<((ostream *)&std::cout,"Residual = ");
  (*(in_RDI->super_Matrix)._vptr_Matrix[0x28])();
  poVar3 = (ostream *)std::ostream::operator<<(poVar2,extraout_XMM0_Qa);
  std::operator<<(poVar3,"; Masks = [");
  pvVar5 = (vector<bool,_std::allocator<bool>_> *)0x0;
  while( true ) {
    this_00 = pvVar5;
    sVar4 = std::vector<bool,_std::allocator<bool>_>::size(in_stack_00000010);
    if ((vector<bool,_std::allocator<bool>_> *)(sVar4 - 1) <= pvVar5) break;
    cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(size_type)poVar2);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,cVar1);
    std::operator<<(poVar3,", ");
    pvVar5 = (vector<bool,_std::allocator<bool>_> *)
             ((long)&(this_00->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 1);
  }
  sVar4 = std::vector<bool,_std::allocator<bool>_>::size(in_stack_00000010);
  if (sVar4 != 0) {
    std::vector<bool,_std::allocator<bool>_>::size(in_stack_00000010);
    cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(size_type)poVar2);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,cVar1);
    std::operator<<(poVar2,"]");
  }
  std::operator<<((ostream *)&std::cout,"\n");
  return;
}

Assistant:

void ezc3d::DataNS::Points3dNS::Point::print() const {
  ezc3d::Vector3d::print();
  std::cout << "Residual = " << residual() << "; Masks = [";
  for (size_t i = 0; i < _cameraMasks.size() - 1; ++i) {
    std::cout << _cameraMasks[i] << ", ";
  }
  if (_cameraMasks.size() > 0) {
    std::cout << _cameraMasks[_cameraMasks.size() - 1] << "]";
  }
  std::cout << "\n";
}